

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O2

string * __thiscall
iDynTree::Material::name_abi_cxx11_(string *__return_storage_ptr__,Material *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_name);
  return __return_storage_ptr__;
}

Assistant:

std::string Material::name() const { return m_name; }